

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_maze.cpp
# Opt level: O2

int random_maze(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *maze,int N)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int j;
  ulong uVar5;
  int max1;
  int iVar6;
  
  uVar3 = 0;
  uVar4 = 0;
  if (0 < N) {
    uVar4 = (ulong)(uint)N;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    iVar6 = 0;
    for (uVar5 = 0; (uint)N != uVar5; uVar5 = uVar5 + 1) {
      if (N / 2 < iVar6) {
        *(undefined4 *)
         (*(long *)&(maze->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar3].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data +
         uVar5 * 4) = 0;
        uVar1 = 0;
      }
      else {
        iVar2 = rand();
        *(int *)(*(long *)&(maze->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar3].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + uVar5 * 4) = iVar2 % 2;
        uVar1 = (uint)(iVar2 % 2 == 1);
      }
      iVar6 = iVar6 + uVar1;
    }
  }
  return 1;
}

Assistant:

int random_maze(vector<vector<int>> &maze, int N)
{
	try
	{

		for (int i = 0; i < N; i++)
		{
			int max1 = 0;
			for (int j = 0; j < N; j++)
			{
				if (max1 <= N / 2)
					maze[i][j] = rand() % 2;
				else
					maze[i][j] = 0;

				if (maze[i][j] == 1)
					max1++;
			}
		}
		return 1;
	}
	catch (const std::exception &)
	{
		cerr << "maze init error";
		return -1;
	}
}